

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_fillreadbuffer(connectdata *conn,size_t bytes,size_t *nreadp)

{
  char **ppcVar1;
  int *piVar2;
  size_t sVar3;
  trailers_state tVar4;
  Curl_easy *data_00;
  char *pcVar5;
  bool bVar6;
  int iVar7;
  CURLcode CVar8;
  Curl_send_buffer *pCVar9;
  size_t sVar10;
  size_t sVar11;
  code *pcVar12;
  char *pcVar13;
  Curl_easy *pCVar14;
  Curl_easy *data;
  curl_slist *trailers;
  char hexbuffer [11];
  curl_slist *local_50;
  char *local_48;
  char local_3b [11];
  
  data_00 = conn->data;
  local_50 = (curl_slist *)0x0;
  if ((data_00->state).trailers_state == TRAILERS_INITIALIZED) {
    Curl_infof(data_00,"Moving trailers state machine from initialized to sending.\n");
    (data_00->state).trailers_state = TRAILERS_SENDING;
    pCVar9 = Curl_add_buffer_init();
    (data_00->state).trailers_buf = pCVar9;
    if (pCVar9 == (Curl_send_buffer *)0x0) {
      Curl_failf(data_00,"Unable to allocate trailing headers buffer !");
      return CURLE_OUT_OF_MEMORY;
    }
    (data_00->state).trailers_bytes_sent = 0;
    Curl_set_in_callback(data_00,true);
    iVar7 = (*(data_00->set).trailer_callback)(&local_50,(data_00->set).trailer_data);
    Curl_set_in_callback(data_00,false);
    if (iVar7 == 0) {
      CVar8 = Curl_http_compile_trailers(local_50,(data_00->state).trailers_buf,data_00);
    }
    else {
      Curl_failf(data_00,"operation aborted by trailing headers callback");
      *nreadp = 0;
      CVar8 = CURLE_ABORTED_BY_CALLBACK;
    }
    if (CVar8 != CURLE_OK) {
      Curl_add_buffer_free(&(data_00->state).trailers_buf);
      curl_slist_free_all(local_50);
      return CVar8;
    }
    Curl_infof(data_00,"Successfully compiled trailers.\r\n");
    curl_slist_free_all(local_50);
  }
  if (((data_00->req).upload_chunky == true) && ((data_00->state).trailers_state == TRAILERS_NONE))
  {
    bytes = bytes - 0xc;
    ppcVar1 = &(data_00->req).upload_fromhere;
    *ppcVar1 = *ppcVar1 + 10;
  }
  if ((data_00->state).trailers_state == TRAILERS_SENDING) {
    pcVar12 = Curl_trailers_read;
    pCVar14 = data_00;
  }
  else {
    pcVar12 = (data_00->state).fread_func;
    pCVar14 = (Curl_easy *)(data_00->state).in;
  }
  Curl_set_in_callback(data_00,true);
  sVar10 = (*pcVar12)((data_00->req).upload_fromhere,1,bytes,pCVar14);
  Curl_set_in_callback(data_00,false);
  if (sVar10 == 0x10000001) {
    if ((conn->handler->flags & 0x10) == 0) {
      piVar2 = &(data_00->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 | 0x20;
      if ((data_00->req).upload_chunky == true) {
        ppcVar1 = &(data_00->req).upload_fromhere;
        *ppcVar1 = *ppcVar1 + -10;
      }
      *nreadp = 0;
      return CURLE_OK;
    }
    pcVar13 = "Read callback asked for PAUSE when not supported!";
LAB_00123a4b:
    Curl_failf(data_00,pcVar13);
    return CURLE_READ_ERROR;
  }
  if (sVar10 == 0x10000000) {
    Curl_failf(data_00,"operation aborted by callback");
    *nreadp = 0;
    return CURLE_ABORTED_BY_CALLBACK;
  }
  if (bytes < sVar10) {
    *nreadp = 0;
    pcVar13 = "read function returned funny value";
    goto LAB_00123a4b;
  }
  if (((data_00->req).forbidchunk != false) || ((data_00->req).upload_chunky != true))
  goto LAB_00123bbe;
  if ((data_00->set).prefer_ascii == false) {
    local_48 = "\r\n";
    if ((data_00->set).crlf != false) {
      local_48 = "\n";
    }
  }
  else {
    local_48 = "\n";
  }
  bVar6 = false;
  if ((data_00->state).trailers_state == TRAILERS_SENDING) {
    iVar7 = 0;
  }
  else {
    iVar7 = curl_msnprintf(local_3b,0xb,"%zx%s",sVar10);
    sVar11 = (size_t)iVar7;
    pcVar13 = (data_00->req).upload_fromhere + -sVar11;
    (data_00->req).upload_fromhere = pcVar13;
    sVar3 = sVar11 + sVar10;
    memcpy(pcVar13,local_3b,sVar11);
    pcVar13 = local_48;
    if (((sVar10 == 0) && ((data_00->set).trailer_callback != (curl_trailer_callback)0x0)) &&
       ((data_00->state).trailers_state == TRAILERS_NONE)) {
      (data_00->state).trailers_state = TRAILERS_INITIALIZED;
      bVar6 = false;
      sVar10 = sVar3;
    }
    else {
      pcVar5 = (data_00->req).upload_fromhere;
      sVar11 = strlen(local_48);
      memcpy(pcVar5 + sVar3,pcVar13,sVar11);
      bVar6 = true;
      sVar10 = sVar3;
    }
  }
  tVar4 = (data_00->state).trailers_state;
  if ((tVar4 == TRAILERS_SENDING) &&
     (((data_00->state).trailers_buf)->size_used == (data_00->state).trailers_bytes_sent)) {
    Curl_add_buffer_free(&(data_00->state).trailers_buf);
    (data_00->state).trailers_state = TRAILERS_DONE;
    (data_00->set).trailer_data = (void *)0x0;
    (data_00->set).trailer_callback = (curl_trailer_callback)0x0;
    pcVar13 = "Signaling end of chunked upload after trailers.\n";
LAB_00123b97:
    (data_00->req).upload_done = true;
    Curl_infof(data_00,pcVar13);
  }
  else if (tVar4 != TRAILERS_INITIALIZED && sVar10 == (long)iVar7) {
    pcVar13 = "Signaling end of chunked upload via terminating chunk.\n";
    goto LAB_00123b97;
  }
  if (bVar6) {
    sVar11 = strlen(local_48);
    sVar10 = sVar10 + sVar11;
  }
LAB_00123bbe:
  *nreadp = sVar10;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_fillreadbuffer(struct connectdata *conn, size_t bytes,
                             size_t *nreadp)
{
  struct Curl_easy *data = conn->data;
  size_t buffersize = bytes;
  size_t nread;

#ifndef CURL_DISABLE_HTTP
  struct curl_slist *trailers = NULL;
  CURLcode c;
  int trailers_ret_code;
#endif

  curl_read_callback readfunc = NULL;
  void *extra_data = NULL;
  bool added_crlf = FALSE;

#ifdef CURL_DOES_CONVERSIONS
  bool sending_http_headers = FALSE;

  if(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)) {
    const struct HTTP *http = data->req.protop;

    if(http->sending == HTTPSEND_REQUEST)
      /* We're sending the HTTP request headers, not the data.
         Remember that so we don't re-translate them into garbage. */
      sending_http_headers = TRUE;
  }
#endif

#ifndef CURL_DISABLE_HTTP
  if(data->state.trailers_state == TRAILERS_INITIALIZED) {
    /* at this point we already verified that the callback exists
       so we compile and store the trailers buffer, then proceed */
    infof(data,
          "Moving trailers state machine from initialized to sending.\n");
    data->state.trailers_state = TRAILERS_SENDING;
    data->state.trailers_buf = Curl_add_buffer_init();
    if(!data->state.trailers_buf) {
      failf(data, "Unable to allocate trailing headers buffer !");
      return CURLE_OUT_OF_MEMORY;
    }
    data->state.trailers_bytes_sent = 0;
    Curl_set_in_callback(data, true);
    trailers_ret_code = data->set.trailer_callback(&trailers,
                                                   data->set.trailer_data);
    Curl_set_in_callback(data, false);
    if(trailers_ret_code == CURL_TRAILERFUNC_OK) {
      c = Curl_http_compile_trailers(trailers, data->state.trailers_buf, data);
    }
    else {
      failf(data, "operation aborted by trailing headers callback");
      *nreadp = 0;
      c = CURLE_ABORTED_BY_CALLBACK;
    }
    if(c != CURLE_OK) {
      Curl_add_buffer_free(&data->state.trailers_buf);
      curl_slist_free_all(trailers);
      return c;
    }
    infof(data, "Successfully compiled trailers.\r\n");
    curl_slist_free_all(trailers);
  }
#endif

  /* if we are transmitting trailing data, we don't need to write
     a chunk size so we skip this */
  if(data->req.upload_chunky &&
     data->state.trailers_state == TRAILERS_NONE) {
    /* if chunked Transfer-Encoding */
    buffersize -= (8 + 2 + 2);   /* 32bit hex + CRLF + CRLF */
    data->req.upload_fromhere += (8 + 2); /* 32bit hex + CRLF */
  }

#ifndef CURL_DISABLE_HTTP
  if(data->state.trailers_state == TRAILERS_SENDING) {
    /* if we're here then that means that we already sent the last empty chunk
       but we didn't send a final CR LF, so we sent 0 CR LF. We then start
       pulling trailing data until we ²have no more at which point we
       simply return to the previous point in the state machine as if
       nothing happened.
       */
    readfunc = Curl_trailers_read;
    extra_data = (void *)data;
  }
  else
#endif
  {
    readfunc = data->state.fread_func;
    extra_data = data->state.in;
  }

  Curl_set_in_callback(data, true);
  nread = readfunc(data->req.upload_fromhere, 1,
                   buffersize, extra_data);
  Curl_set_in_callback(data, false);

  if(nread == CURL_READFUNC_ABORT) {
    failf(data, "operation aborted by callback");
    *nreadp = 0;
    return CURLE_ABORTED_BY_CALLBACK;
  }
  if(nread == CURL_READFUNC_PAUSE) {
    struct SingleRequest *k = &data->req;

    if(conn->handler->flags & PROTOPT_NONETWORK) {
      /* protocols that work without network cannot be paused. This is
         actually only FILE:// just now, and it can't pause since the transfer
         isn't done using the "normal" procedure. */
      failf(data, "Read callback asked for PAUSE when not supported!");
      return CURLE_READ_ERROR;
    }

    /* CURL_READFUNC_PAUSE pauses read callbacks that feed socket writes */
    k->keepon |= KEEP_SEND_PAUSE; /* mark socket send as paused */
    if(data->req.upload_chunky) {
        /* Back out the preallocation done above */
      data->req.upload_fromhere -= (8 + 2);
    }
    *nreadp = 0;

    return CURLE_OK; /* nothing was read */
  }
  else if(nread > buffersize) {
    /* the read function returned a too large value */
    *nreadp = 0;
    failf(data, "read function returned funny value");
    return CURLE_READ_ERROR;
  }

  if(!data->req.forbidchunk && data->req.upload_chunky) {
    /* if chunked Transfer-Encoding
     *    build chunk:
     *
     *        <HEX SIZE> CRLF
     *        <DATA> CRLF
     */
    /* On non-ASCII platforms the <DATA> may or may not be
       translated based on set.prefer_ascii while the protocol
       portion must always be translated to the network encoding.
       To further complicate matters, line end conversion might be
       done later on, so we need to prevent CRLFs from becoming
       CRCRLFs if that's the case.  To do this we use bare LFs
       here, knowing they'll become CRLFs later on.
     */

    char hexbuffer[11];
    const char *endofline_native;
    const char *endofline_network;
    int hexlen = 0;

    if(
#ifdef CURL_DO_LINEEND_CONV
       (data->set.prefer_ascii) ||
#endif
       (data->set.crlf)) {
      /* \n will become \r\n later on */
      endofline_native  = "\n";
      endofline_network = "\x0a";
    }
    else {
      endofline_native  = "\r\n";
      endofline_network = "\x0d\x0a";
    }

    /* if we're not handling trailing data, proceed as usual */
    if(data->state.trailers_state != TRAILERS_SENDING) {
      hexlen = msnprintf(hexbuffer, sizeof(hexbuffer),
                         "%zx%s", nread, endofline_native);

      /* move buffer pointer */
      data->req.upload_fromhere -= hexlen;
      nread += hexlen;

      /* copy the prefix to the buffer, leaving out the NUL */
      memcpy(data->req.upload_fromhere, hexbuffer, hexlen);

      /* always append ASCII CRLF to the data unless
         we have a valid trailer callback */
#ifndef CURL_DISABLE_HTTP
      if((nread-hexlen) == 0 &&
          data->set.trailer_callback != NULL &&
          data->state.trailers_state == TRAILERS_NONE) {
        data->state.trailers_state = TRAILERS_INITIALIZED;
      }
      else
#endif
      {
        memcpy(data->req.upload_fromhere + nread,
               endofline_network,
               strlen(endofline_network));
        added_crlf = TRUE;
      }
    }

#ifdef CURL_DOES_CONVERSIONS
    {
      CURLcode result;
      size_t length;
      if(data->set.prefer_ascii)
        /* translate the protocol and data */
        length = nread;
      else
        /* just translate the protocol portion */
        length = strlen(hexbuffer);
      result = Curl_convert_to_network(data, data->req.upload_fromhere,
                                       length);
      /* Curl_convert_to_network calls failf if unsuccessful */
      if(result)
        return result;
    }
#endif /* CURL_DOES_CONVERSIONS */

#ifndef CURL_DISABLE_HTTP
    if(data->state.trailers_state == TRAILERS_SENDING &&
       !Curl_trailers_left(data)) {
      Curl_add_buffer_free(&data->state.trailers_buf);
      data->state.trailers_state = TRAILERS_DONE;
      data->set.trailer_data = NULL;
      data->set.trailer_callback = NULL;
      /* mark the transfer as done */
      data->req.upload_done = TRUE;
      infof(data, "Signaling end of chunked upload after trailers.\n");
    }
    else
#endif
      if((nread - hexlen) == 0 &&
         data->state.trailers_state != TRAILERS_INITIALIZED) {
        /* mark this as done once this chunk is transferred */
        data->req.upload_done = TRUE;
        infof(data,
              "Signaling end of chunked upload via terminating chunk.\n");
      }

    if(added_crlf)
      nread += strlen(endofline_network); /* for the added end of line */
  }
#ifdef CURL_DOES_CONVERSIONS
  else if((data->set.prefer_ascii) && (!sending_http_headers)) {
    CURLcode result;
    result = Curl_convert_to_network(data, data->req.upload_fromhere, nread);
    /* Curl_convert_to_network calls failf if unsuccessful */
    if(result)
      return result;
  }
#endif /* CURL_DOES_CONVERSIONS */

  *nreadp = nread;

  return CURLE_OK;
}